

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  ostream *poVar1;
  string val;
  string local_48;
  
  if (name->_M_string_length == 0) {
    std::operator+(&local_48,"No name given for WriteVariable! called with comment: ",comment);
    cmSystemTools::Error(&local_48);
  }
  else {
    cmSystemTools::TrimWhitespace(&local_48,value);
    if (local_48._M_string_length != 0) {
      WriteComment(os,comment);
      Indent(os,indent);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if (name.empty()) {
    cmSystemTools::Error("No name given for WriteVariable! called "
                         "with comment: " +
                         comment);
    return;
  }

  // Do not add a variable if the value is empty.
  std::string val = cmSystemTools::TrimWhitespace(value);
  if (val.empty()) {
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}